

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::
     PrintTupleTo<std::tuple<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&,std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,std::optional<SDL_Rect>const&,std::optional<SDL_Rect>const&>,2ul>
               (long t,ostream *param_2)

{
  UniversalPrinter<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  Print(*(unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> **)(t + 0x18),param_2);
  std::__ostream_insert<char,std::char_traits<char>>(param_2,", ",2);
  UniversalPrinter<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
  Print(*(unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> **)(t + 0x10),param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}